

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_unlink_elem(ly_ctx *ctx,lyxml_elem *elem,int copy_ns)

{
  lyxml_elem *plVar1;
  lyxml_elem *local_30;
  lyxml_elem *first;
  lyxml_elem *parent;
  int copy_ns_local;
  lyxml_elem *elem_local;
  ly_ctx *ctx_local;
  
  if (elem != (lyxml_elem *)0x0) {
    plVar1 = elem->parent;
    if (plVar1 != (lyxml_elem *)0x0) {
      if (plVar1->child == elem) {
        plVar1->child = elem->next;
      }
      elem->parent = (lyxml_elem *)0x0;
    }
    if (copy_ns < 2) {
      lyxml_correct_elem_ns(ctx,elem,copy_ns,1);
    }
    if (elem->prev != elem) {
      if (elem->next == (lyxml_elem *)0x0) {
        local_30 = elem;
        if (plVar1 == (lyxml_elem *)0x0) {
          while (local_30->prev->next != (lyxml_elem *)0x0) {
            local_30 = local_30->prev;
          }
        }
        else {
          local_30 = plVar1->child;
        }
        local_30->prev = elem->prev;
      }
      else {
        elem->next->prev = elem->prev;
      }
      if (elem->prev->next != (lyxml_elem *)0x0) {
        elem->prev->next = elem->next;
      }
      elem->next = (lyxml_elem *)0x0;
      elem->prev = elem;
    }
  }
  return;
}

Assistant:

void
lyxml_unlink_elem(struct ly_ctx *ctx, struct lyxml_elem *elem, int copy_ns)
{
    struct lyxml_elem *parent, *first;

    if (!elem) {
        return;
    }

    /* store pointers to important nodes */
    parent = elem->parent;

    /* unlink from parent */
    if (parent) {
        if (parent->child == elem) {
            /* we unlink the first child */
            /* update the parent's link */
            parent->child = elem->next;
        }
        /* forget about the parent */
        elem->parent = NULL;
    }

    if (copy_ns < 2) {
        lyxml_correct_elem_ns(ctx, elem, copy_ns, 1);
    }

    /* unlink from siblings */
    if (elem->prev == elem) {
        /* there are no more siblings */
        return;
    }
    if (elem->next) {
        elem->next->prev = elem->prev;
    } else {
        /* unlinking the last element */
        if (parent) {
            first = parent->child;
        } else {
            first = elem;
            while (first->prev->next) {
                first = first->prev;
            }
        }
        first->prev = elem->prev;
    }
    if (elem->prev->next) {
        elem->prev->next = elem->next;
    }

    /* clean up the unlinked element */
    elem->next = NULL;
    elem->prev = elem;
}